

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O1

uint32_t Interpret(vector<bool,_std::allocator<bool>_> *asmap,
                  vector<bool,_std::allocator<bool>_> *ip)

{
  ulong uVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  uint32_t uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char cVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  uint32_t local_70;
  uint32_t local_6c;
  const_iterator local_58;
  const_iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.super__Bit_iterator_base._M_p =
       (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  local_48.super__Bit_iterator_base._M_offset = 0;
  p_Var3 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar2 = (asmap->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  p_Var4 = (ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  local_58.super__Bit_iterator_base._M_p = p_Var3;
  local_58.super__Bit_iterator_base._M_offset = uVar2;
  if ((local_48.super__Bit_iterator_base._M_p != p_Var3) || (uVar2 != 0)) {
    uVar1 = (ulong)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(ip->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_finish.super__Bit_iterator_base._M_p - (long)p_Var4) * 8;
    local_6c = 0;
    uVar6 = uVar1 & 0xffffffff;
    do {
      uVar5 = anon_unknown.dwarf_30a146b::DecodeBits
                        (&local_48,&local_58,'\0',
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (anonymous_namespace)::TYPE_BIT_SIZES);
      cVar12 = (char)uVar6;
      switch(uVar5) {
      case 0:
        local_70 = anon_unknown.dwarf_30a146b::DecodeBits
                             (&local_48,&local_58,'\x01',
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (anonymous_namespace)::ASN_BIT_SIZES);
        if (local_70 != 0xffffffff) {
LAB_00768a62:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return local_70;
        }
        goto switchD_00768849_default;
      case 1:
        uVar5 = anon_unknown.dwarf_30a146b::DecodeBits
                          (&local_48,&local_58,'\x11',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::JUMP_BIT_SIZES);
        if ((uVar5 == 0xffffffff) || (cVar12 == '\0')) goto switchD_00768849_default;
        if ((long)(((ulong)uVar2 - (ulong)local_48.super__Bit_iterator_base._M_offset) +
                  ((long)p_Var3 - (long)local_48.super__Bit_iterator_base._M_p) * 8) <=
            (long)(ulong)uVar5) goto switchD_00768849_default;
        uVar8 = uVar1 - (uVar6 & 0xff);
        uVar6 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar6 = uVar8;
        }
        if ((p_Var4[((long)uVar6 >> 6) +
                    (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
             >> (uVar8 & 0x3f) & 1) != 0) {
          uVar6 = (ulong)local_48.super__Bit_iterator_base._M_offset + (ulong)uVar5;
          local_48.super__Bit_iterator_base._M_p =
               local_48.super__Bit_iterator_base._M_p + (uVar6 >> 6);
          local_48.super__Bit_iterator_base._M_offset = (uint)uVar6 & 0x3f;
        }
        uVar6 = (ulong)(byte)(cVar12 - 1);
        break;
      case 2:
        uVar5 = anon_unknown.dwarf_30a146b::DecodeBits
                          (&local_48,&local_58,'\x02',
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (anonymous_namespace)::MATCH_BIT_SIZES);
        if (uVar5 == 0xffffffff) goto switchD_00768849_default;
        if (uVar5 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = uVar9 ^ 0x1f;
        }
        if (((uint)uVar6 & 0xff) < 0x1f - uVar9) goto switchD_00768849_default;
        bVar14 = uVar9 != 0x1f;
        if (bVar14) {
          iVar7 = 0x1e - uVar9;
          uVar10 = 1;
          do {
            uVar11 = uVar1 - (uVar6 & 0xff);
            uVar8 = uVar11 + 0x3f;
            if (-1 < (long)uVar11) {
              uVar8 = uVar11;
            }
            if ((((byte)(uVar5 >> ((byte)iVar7 & 0x1f)) ^
                 (p_Var4[((long)uVar8 >> 6) +
                         (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                         0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) != 0) & 1) != 0) {
              local_70 = local_6c;
              goto LAB_00768a00;
            }
            uVar6 = (ulong)(byte)((char)uVar6 - 1);
            bVar14 = uVar10 < 0x1f - uVar9;
            uVar10 = uVar10 + 1;
            bVar13 = iVar7 != 0;
            iVar7 = iVar7 + -1;
          } while (bVar13);
          uVar6 = (ulong)(byte)((cVar12 + (char)uVar9) - 0x1f);
        }
LAB_00768a00:
        if (bVar14) goto LAB_00768a62;
        break;
      case 3:
        local_6c = anon_unknown.dwarf_30a146b::DecodeBits
                             (&local_48,&local_58,'\x01',
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (anonymous_namespace)::ASN_BIT_SIZES);
        if (local_6c == 0xffffffff) goto switchD_00768849_default;
        break;
      default:
        goto switchD_00768849_default;
      }
    } while ((local_48.super__Bit_iterator_base._M_p != p_Var3) ||
            (local_48.super__Bit_iterator_base._M_offset != uVar2));
  }
switchD_00768849_default:
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
                ,0x81,"uint32_t Interpret(const std::vector<bool> &, const std::vector<bool> &)");
}

Assistant:

uint32_t Interpret(const std::vector<bool> &asmap, const std::vector<bool> &ip)
{
    std::vector<bool>::const_iterator pos = asmap.begin();
    const std::vector<bool>::const_iterator endpos = asmap.end();
    uint8_t bits = ip.size();
    uint32_t default_asn = 0;
    uint32_t jump, match, matchlen;
    Instruction opcode;
    while (pos != endpos) {
        opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            default_asn = DecodeASN(pos, endpos);
            if (default_asn == INVALID) break; // ASN straddles EOF
            return default_asn;
        } else if (opcode == Instruction::JUMP) {
            jump = DecodeJump(pos, endpos);
            if (jump == INVALID) break; // Jump offset straddles EOF
            if (bits == 0) break; // No input bits left
            if (int64_t{jump} >= int64_t{endpos - pos}) break; // Jumping past EOF
            if (ip[ip.size() - bits]) {
                pos += jump;
            }
            bits--;
        } else if (opcode == Instruction::MATCH) {
            match = DecodeMatch(pos, endpos);
            if (match == INVALID) break; // Match bits straddle EOF
            matchlen = std::bit_width(match) - 1;
            if (bits < matchlen) break; // Not enough input bits
            for (uint32_t bit = 0; bit < matchlen; bit++) {
                if ((ip[ip.size() - bits]) != ((match >> (matchlen - 1 - bit)) & 1)) {
                    return default_asn;
                }
                bits--;
            }
        } else if (opcode == Instruction::DEFAULT) {
            default_asn = DecodeASN(pos, endpos);
            if (default_asn == INVALID) break; // ASN straddles EOF
        } else {
            break; // Instruction straddles EOF
        }
    }
    assert(false); // Reached EOF without RETURN, or aborted (see any of the breaks above) - should have been caught by SanityCheckASMap below
    return 0; // 0 is not a valid ASN
}